

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<bssl::(anonymous_namespace)::TrustStoreCollectionTest_NoStores_Test>::CreateTest
          (TestFactoryImpl<bssl::(anonymous_namespace)::TrustStoreCollectionTest_NoStores_Test>
           *this)

{
  Test *this_00;
  TestFactoryImpl<bssl::(anonymous_namespace)::TrustStoreCollectionTest_NoStores_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x70);
  bssl::anon_unknown_0::TrustStoreCollectionTest_NoStores_Test::
  TrustStoreCollectionTest_NoStores_Test((TrustStoreCollectionTest_NoStores_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }